

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_count.hpp
# Opt level: O0

weak_count * __thiscall boost::detail::weak_count::operator=(weak_count *this,shared_count *r)

{
  sp_counted_base *psVar1;
  long *in_RSI;
  sp_counted_base *in_RDI;
  sp_counted_base *tmp;
  
  psVar1 = (sp_counted_base *)*in_RSI;
  if (psVar1 != (sp_counted_base *)in_RDI->_vptr_sp_counted_base) {
    if (psVar1 != (sp_counted_base *)0x0) {
      sp_counted_base::weak_add_ref((sp_counted_base *)0xa0f971);
    }
    if (in_RDI->_vptr_sp_counted_base != (_func_int **)0x0) {
      sp_counted_base::weak_release(in_RDI);
    }
    in_RDI->_vptr_sp_counted_base = (_func_int **)psVar1;
  }
  return (weak_count *)in_RDI;
}

Assistant:

weak_count & operator= (shared_count const & r) // nothrow
    {
        sp_counted_base * tmp = r.pi_;

        if( tmp != pi_ )
        {
            if(tmp != 0) tmp->weak_add_ref();
            if(pi_ != 0) pi_->weak_release();
            pi_ = tmp;
        }

        return *this;
    }